

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# low-level.cpp
# Opt level: O3

void __thiscall spatial_region::spatial_region(spatial_region *this)

{
  int iVar1;
  int iVar2;
  undefined1 auVar3 [32];
  field3d<cellb> local_78;
  field3d<cellb> *local_50;
  field3d<celle> *local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  local_38 = &(this->data_folder).field_2;
  (this->advance_momentum)._M_invoker = (_Invoker_type)0x0;
  auVar3 = ZEXT1632(ZEXT816(0) << 0x40);
  this->solver = (unique_ptr<maxwell_solver,_std::default_delete<maxwell_solver>_>)auVar3._0_8_;
  (this->advance_momentum).super__Function_base._M_functor = (_Any_data)SUB2416(auVar3._8_24_,0);
  (this->advance_momentum).super__Function_base._M_manager =
       (_Manager_type)SUB248(auVar3._8_24_,0x10);
  (this->data_folder)._M_dataplus._M_p = (pointer)local_38;
  (this->data_folder)._M_string_length = 0;
  (this->data_folder).field_2._M_local_buf[0] = '\0';
  (this->ce).nx = 0;
  (this->ce).ny = 0;
  (this->ce).nz = 0;
  this->nx = 0;
  this->ny = 0;
  this->nz = 0;
  *(undefined1 (*) [32])&(this->ce).p = auVar3;
  (this->cb).nz = 0;
  auVar3 = ZEXT1632(ZEXT816(0) << 0x40);
  *(undefined1 (*) [32])&(this->cb).p = auVar3;
  (this->cj).nz = 0;
  *(undefined1 (*) [32])&(this->cj).p = auVar3;
  (this->cbe).nz = 0;
  *(undefined1 (*) [32])&(this->cbe).p = auVar3;
  (this->cp).nz = 0;
  local_50 = &this->cb;
  (this->deleted_particles).
  super__Vector_base<spatial_region::deleted_particle,_std::allocator<spatial_region::deleted_particle>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_40 = &this->ce;
  *(undefined1 (*) [64])&(this->cp).p = ZEXT464(0) << 0x40;
  this->dx = 1.0;
  this->dy = 1.0;
  this->dz = 1.0;
  this->dt = 0.5;
  this->xnpic = 1;
  this->ynpic = 1;
  this->znpic = 1;
  this->e_s = 10000000000.0;
  local_78.nx = 0;
  local_78.ny = 0;
  local_78.nz = 0;
  local_78.p3._M_t.super___uniq_ptr_impl<cellb,_std::default_delete<cellb[]>_>._M_t.
  super__Tuple_impl<0UL,_cellb_*,_std::default_delete<cellb[]>_>.
  super__Head_base<0UL,_cellb_*,_false>._M_head_impl =
       (__uniq_ptr_data<cellb,_std::default_delete<cellb[]>,_true,_true>)
       (__uniq_ptr_impl<cellb,_std::default_delete<cellb[]>_>)0x0;
  local_78.p._M_t.super___uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>._M_t.
  super__Tuple_impl<0UL,_cellb_***,_std::default_delete<cellb_**[]>_>.
  super__Head_base<0UL,_cellb_***,_false>._M_head_impl =
       (__uniq_ptr_data<cellb_**,_std::default_delete<cellb_**[]>,_true,_true>)
       (__uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>)0x0;
  local_78.p2._M_t.super___uniq_ptr_impl<cellb_*,_std::default_delete<cellb_*[]>_>._M_t.
  super__Tuple_impl<0UL,_cellb_**,_std::default_delete<cellb_*[]>_>.
  super__Head_base<0UL,_cellb_**,_false>._M_head_impl =
       (__uniq_ptr_data<cellb_*,_std::default_delete<cellb_*[]>,_true,_true>)
       (__uniq_ptr_impl<cellb_*,_std::default_delete<cellb_*[]>_>)0x0;
  field3d<celle>::operator=(local_40,(field3d<celle> *)&local_78);
  if ((_Head_base<0UL,_cellb_*,_false>)
      local_78.p3._M_t.super___uniq_ptr_impl<cellb,_std::default_delete<cellb[]>_>._M_t.
      super__Tuple_impl<0UL,_cellb_*,_std::default_delete<cellb[]>_>.
      super__Head_base<0UL,_cellb_*,_false>._M_head_impl != (_Head_base<0UL,_cellb_*,_false>)0x0) {
    operator_delete__((void *)local_78.p3._M_t.
                              super___uniq_ptr_impl<cellb,_std::default_delete<cellb[]>_>._M_t.
                              super__Tuple_impl<0UL,_cellb_*,_std::default_delete<cellb[]>_>.
                              super__Head_base<0UL,_cellb_*,_false>._M_head_impl);
  }
  local_78.p3._M_t.super___uniq_ptr_impl<cellb,_std::default_delete<cellb[]>_>._M_t.
  super__Tuple_impl<0UL,_cellb_*,_std::default_delete<cellb[]>_>.
  super__Head_base<0UL,_cellb_*,_false>._M_head_impl =
       (__uniq_ptr_data<cellb,_std::default_delete<cellb[]>,_true,_true>)
       (__uniq_ptr_impl<cellb,_std::default_delete<cellb[]>_>)0x0;
  if ((_Tuple_impl<0UL,_cellb_**,_std::default_delete<cellb_*[]>_>)
      local_78.p2._M_t.super___uniq_ptr_impl<cellb_*,_std::default_delete<cellb_*[]>_>._M_t.
      super__Tuple_impl<0UL,_cellb_**,_std::default_delete<cellb_*[]>_>.
      super__Head_base<0UL,_cellb_**,_false>._M_head_impl != (cellb **)0x0) {
    operator_delete__((void *)local_78.p2._M_t.
                              super___uniq_ptr_impl<cellb_*,_std::default_delete<cellb_*[]>_>._M_t.
                              super__Tuple_impl<0UL,_cellb_**,_std::default_delete<cellb_*[]>_>.
                              super__Head_base<0UL,_cellb_**,_false>._M_head_impl);
  }
  local_78.p2._M_t.super___uniq_ptr_impl<cellb_*,_std::default_delete<cellb_*[]>_>._M_t.
  super__Tuple_impl<0UL,_cellb_**,_std::default_delete<cellb_*[]>_>.
  super__Head_base<0UL,_cellb_**,_false>._M_head_impl =
       (__uniq_ptr_data<cellb_*,_std::default_delete<cellb_*[]>,_true,_true>)
       (__uniq_ptr_impl<cellb_*,_std::default_delete<cellb_*[]>_>)0x0;
  if (local_78.p._M_t.super___uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>._M_t.
      super__Tuple_impl<0UL,_cellb_***,_std::default_delete<cellb_**[]>_>.
      super__Head_base<0UL,_cellb_***,_false>._M_head_impl !=
      (__uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>)0x0) {
    operator_delete__((void *)local_78.p._M_t.
                              super___uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>._M_t
                              .super__Tuple_impl<0UL,_cellb_***,_std::default_delete<cellb_**[]>_>.
                              super__Head_base<0UL,_cellb_***,_false>._M_head_impl);
  }
  local_78.nx = 0;
  local_78.ny = 0;
  local_78.nz = 0;
  local_78.p3._M_t.super___uniq_ptr_impl<cellb,_std::default_delete<cellb[]>_>._M_t.
  super__Tuple_impl<0UL,_cellb_*,_std::default_delete<cellb[]>_>.
  super__Head_base<0UL,_cellb_*,_false>._M_head_impl =
       (__uniq_ptr_data<cellb,_std::default_delete<cellb[]>,_true,_true>)
       (__uniq_ptr_impl<cellb,_std::default_delete<cellb[]>_>)0x0;
  local_78.p._M_t.super___uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>._M_t.
  super__Tuple_impl<0UL,_cellb_***,_std::default_delete<cellb_**[]>_>.
  super__Head_base<0UL,_cellb_***,_false>._M_head_impl =
       (__uniq_ptr_data<cellb_**,_std::default_delete<cellb_**[]>,_true,_true>)
       (__uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>)0x0;
  local_78.p2._M_t.super___uniq_ptr_impl<cellb_*,_std::default_delete<cellb_*[]>_>._M_t.
  super__Tuple_impl<0UL,_cellb_**,_std::default_delete<cellb_*[]>_>.
  super__Head_base<0UL,_cellb_**,_false>._M_head_impl =
       (__uniq_ptr_data<cellb_*,_std::default_delete<cellb_*[]>,_true,_true>)
       (__uniq_ptr_impl<cellb_*,_std::default_delete<cellb_*[]>_>)0x0;
  field3d<cellj>::operator=(&this->cj,(field3d<cellj> *)&local_78);
  if ((_Head_base<0UL,_cellb_*,_false>)
      local_78.p3._M_t.super___uniq_ptr_impl<cellb,_std::default_delete<cellb[]>_>._M_t.
      super__Tuple_impl<0UL,_cellb_*,_std::default_delete<cellb[]>_>.
      super__Head_base<0UL,_cellb_*,_false>._M_head_impl != (_Head_base<0UL,_cellb_*,_false>)0x0) {
    operator_delete__((void *)local_78.p3._M_t.
                              super___uniq_ptr_impl<cellb,_std::default_delete<cellb[]>_>._M_t.
                              super__Tuple_impl<0UL,_cellb_*,_std::default_delete<cellb[]>_>.
                              super__Head_base<0UL,_cellb_*,_false>._M_head_impl);
  }
  local_78.p3._M_t.super___uniq_ptr_impl<cellb,_std::default_delete<cellb[]>_>._M_t.
  super__Tuple_impl<0UL,_cellb_*,_std::default_delete<cellb[]>_>.
  super__Head_base<0UL,_cellb_*,_false>._M_head_impl =
       (__uniq_ptr_data<cellb,_std::default_delete<cellb[]>,_true,_true>)
       (__uniq_ptr_impl<cellb,_std::default_delete<cellb[]>_>)0x0;
  if ((_Tuple_impl<0UL,_cellb_**,_std::default_delete<cellb_*[]>_>)
      local_78.p2._M_t.super___uniq_ptr_impl<cellb_*,_std::default_delete<cellb_*[]>_>._M_t.
      super__Tuple_impl<0UL,_cellb_**,_std::default_delete<cellb_*[]>_>.
      super__Head_base<0UL,_cellb_**,_false>._M_head_impl != (cellb **)0x0) {
    operator_delete__((void *)local_78.p2._M_t.
                              super___uniq_ptr_impl<cellb_*,_std::default_delete<cellb_*[]>_>._M_t.
                              super__Tuple_impl<0UL,_cellb_**,_std::default_delete<cellb_*[]>_>.
                              super__Head_base<0UL,_cellb_**,_false>._M_head_impl);
  }
  local_78.p2._M_t.super___uniq_ptr_impl<cellb_*,_std::default_delete<cellb_*[]>_>._M_t.
  super__Tuple_impl<0UL,_cellb_**,_std::default_delete<cellb_*[]>_>.
  super__Head_base<0UL,_cellb_**,_false>._M_head_impl =
       (__uniq_ptr_data<cellb_*,_std::default_delete<cellb_*[]>,_true,_true>)
       (__uniq_ptr_impl<cellb_*,_std::default_delete<cellb_*[]>_>)0x0;
  if (local_78.p._M_t.super___uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>._M_t.
      super__Tuple_impl<0UL,_cellb_***,_std::default_delete<cellb_**[]>_>.
      super__Head_base<0UL,_cellb_***,_false>._M_head_impl !=
      (__uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>)0x0) {
    operator_delete__((void *)local_78.p._M_t.
                              super___uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>._M_t
                              .super__Tuple_impl<0UL,_cellb_***,_std::default_delete<cellb_**[]>_>.
                              super__Head_base<0UL,_cellb_***,_false>._M_head_impl);
  }
  local_78.nx = 0;
  local_78.ny = 0;
  local_78.nz = 0;
  local_78.p3._M_t.super___uniq_ptr_impl<cellb,_std::default_delete<cellb[]>_>._M_t.
  super__Tuple_impl<0UL,_cellb_*,_std::default_delete<cellb[]>_>.
  super__Head_base<0UL,_cellb_*,_false>._M_head_impl =
       (__uniq_ptr_data<cellb,_std::default_delete<cellb[]>,_true,_true>)
       (__uniq_ptr_impl<cellb,_std::default_delete<cellb[]>_>)0x0;
  local_78.p._M_t.super___uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>._M_t.
  super__Tuple_impl<0UL,_cellb_***,_std::default_delete<cellb_**[]>_>.
  super__Head_base<0UL,_cellb_***,_false>._M_head_impl =
       (__uniq_ptr_data<cellb_**,_std::default_delete<cellb_**[]>,_true,_true>)
       (__uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>)0x0;
  local_78.p2._M_t.super___uniq_ptr_impl<cellb_*,_std::default_delete<cellb_*[]>_>._M_t.
  super__Tuple_impl<0UL,_cellb_**,_std::default_delete<cellb_*[]>_>.
  super__Head_base<0UL,_cellb_**,_false>._M_head_impl =
       (__uniq_ptr_data<cellb_*,_std::default_delete<cellb_*[]>,_true,_true>)
       (__uniq_ptr_impl<cellb_*,_std::default_delete<cellb_*[]>_>)0x0;
  field3d<cellb>::operator=(local_50,&local_78);
  if ((_Head_base<0UL,_cellb_*,_false>)
      local_78.p3._M_t.super___uniq_ptr_impl<cellb,_std::default_delete<cellb[]>_>._M_t.
      super__Tuple_impl<0UL,_cellb_*,_std::default_delete<cellb[]>_>.
      super__Head_base<0UL,_cellb_*,_false>._M_head_impl != (_Head_base<0UL,_cellb_*,_false>)0x0) {
    operator_delete__((void *)local_78.p3._M_t.
                              super___uniq_ptr_impl<cellb,_std::default_delete<cellb[]>_>._M_t.
                              super__Tuple_impl<0UL,_cellb_*,_std::default_delete<cellb[]>_>.
                              super__Head_base<0UL,_cellb_*,_false>._M_head_impl);
  }
  local_78.p3._M_t.super___uniq_ptr_impl<cellb,_std::default_delete<cellb[]>_>._M_t.
  super__Tuple_impl<0UL,_cellb_*,_std::default_delete<cellb[]>_>.
  super__Head_base<0UL,_cellb_*,_false>._M_head_impl =
       (__uniq_ptr_data<cellb,_std::default_delete<cellb[]>,_true,_true>)
       (__uniq_ptr_impl<cellb,_std::default_delete<cellb[]>_>)0x0;
  if ((_Tuple_impl<0UL,_cellb_**,_std::default_delete<cellb_*[]>_>)
      local_78.p2._M_t.super___uniq_ptr_impl<cellb_*,_std::default_delete<cellb_*[]>_>._M_t.
      super__Tuple_impl<0UL,_cellb_**,_std::default_delete<cellb_*[]>_>.
      super__Head_base<0UL,_cellb_**,_false>._M_head_impl != (cellb **)0x0) {
    operator_delete__((void *)local_78.p2._M_t.
                              super___uniq_ptr_impl<cellb_*,_std::default_delete<cellb_*[]>_>._M_t.
                              super__Tuple_impl<0UL,_cellb_**,_std::default_delete<cellb_*[]>_>.
                              super__Head_base<0UL,_cellb_**,_false>._M_head_impl);
  }
  local_78.p2._M_t.super___uniq_ptr_impl<cellb_*,_std::default_delete<cellb_*[]>_>._M_t.
  super__Tuple_impl<0UL,_cellb_**,_std::default_delete<cellb_*[]>_>.
  super__Head_base<0UL,_cellb_**,_false>._M_head_impl =
       (__uniq_ptr_data<cellb_*,_std::default_delete<cellb_*[]>,_true,_true>)
       (__uniq_ptr_impl<cellb_*,_std::default_delete<cellb_*[]>_>)0x0;
  if (local_78.p._M_t.super___uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>._M_t.
      super__Tuple_impl<0UL,_cellb_***,_std::default_delete<cellb_**[]>_>.
      super__Head_base<0UL,_cellb_***,_false>._M_head_impl !=
      (__uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>)0x0) {
    operator_delete__((void *)local_78.p._M_t.
                              super___uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>._M_t
                              .super__Tuple_impl<0UL,_cellb_***,_std::default_delete<cellb_**[]>_>.
                              super__Head_base<0UL,_cellb_***,_false>._M_head_impl);
  }
  local_78.nx = 0;
  local_78.ny = 0;
  local_78.nz = 0;
  local_78.p3._M_t.super___uniq_ptr_impl<cellb,_std::default_delete<cellb[]>_>._M_t.
  super__Tuple_impl<0UL,_cellb_*,_std::default_delete<cellb[]>_>.
  super__Head_base<0UL,_cellb_*,_false>._M_head_impl =
       (__uniq_ptr_data<cellb,_std::default_delete<cellb[]>,_true,_true>)
       (__uniq_ptr_impl<cellb,_std::default_delete<cellb[]>_>)0x0;
  local_78.p._M_t.super___uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>._M_t.
  super__Tuple_impl<0UL,_cellb_***,_std::default_delete<cellb_**[]>_>.
  super__Head_base<0UL,_cellb_***,_false>._M_head_impl =
       (__uniq_ptr_data<cellb_**,_std::default_delete<cellb_**[]>,_true,_true>)
       (__uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>)0x0;
  local_78.p2._M_t.super___uniq_ptr_impl<cellb_*,_std::default_delete<cellb_*[]>_>._M_t.
  super__Tuple_impl<0UL,_cellb_**,_std::default_delete<cellb_*[]>_>.
  super__Head_base<0UL,_cellb_**,_false>._M_head_impl =
       (__uniq_ptr_data<cellb_*,_std::default_delete<cellb_*[]>,_true,_true>)
       (__uniq_ptr_impl<cellb_*,_std::default_delete<cellb_*[]>_>)0x0;
  field3d<cellbe>::operator=(&this->cbe,(field3d<cellbe> *)&local_78);
  if ((_Head_base<0UL,_cellb_*,_false>)
      local_78.p3._M_t.super___uniq_ptr_impl<cellb,_std::default_delete<cellb[]>_>._M_t.
      super__Tuple_impl<0UL,_cellb_*,_std::default_delete<cellb[]>_>.
      super__Head_base<0UL,_cellb_*,_false>._M_head_impl != (_Head_base<0UL,_cellb_*,_false>)0x0) {
    operator_delete__((void *)local_78.p3._M_t.
                              super___uniq_ptr_impl<cellb,_std::default_delete<cellb[]>_>._M_t.
                              super__Tuple_impl<0UL,_cellb_*,_std::default_delete<cellb[]>_>.
                              super__Head_base<0UL,_cellb_*,_false>._M_head_impl);
  }
  local_78.p3._M_t.super___uniq_ptr_impl<cellb,_std::default_delete<cellb[]>_>._M_t.
  super__Tuple_impl<0UL,_cellb_*,_std::default_delete<cellb[]>_>.
  super__Head_base<0UL,_cellb_*,_false>._M_head_impl =
       (__uniq_ptr_data<cellb,_std::default_delete<cellb[]>,_true,_true>)
       (__uniq_ptr_impl<cellb,_std::default_delete<cellb[]>_>)0x0;
  if ((_Tuple_impl<0UL,_cellb_**,_std::default_delete<cellb_*[]>_>)
      local_78.p2._M_t.super___uniq_ptr_impl<cellb_*,_std::default_delete<cellb_*[]>_>._M_t.
      super__Tuple_impl<0UL,_cellb_**,_std::default_delete<cellb_*[]>_>.
      super__Head_base<0UL,_cellb_**,_false>._M_head_impl != (cellb **)0x0) {
    operator_delete__((void *)local_78.p2._M_t.
                              super___uniq_ptr_impl<cellb_*,_std::default_delete<cellb_*[]>_>._M_t.
                              super__Tuple_impl<0UL,_cellb_**,_std::default_delete<cellb_*[]>_>.
                              super__Head_base<0UL,_cellb_**,_false>._M_head_impl);
  }
  local_78.p2._M_t.super___uniq_ptr_impl<cellb_*,_std::default_delete<cellb_*[]>_>._M_t.
  super__Tuple_impl<0UL,_cellb_**,_std::default_delete<cellb_*[]>_>.
  super__Head_base<0UL,_cellb_**,_false>._M_head_impl =
       (__uniq_ptr_data<cellb_*,_std::default_delete<cellb_*[]>,_true,_true>)
       (__uniq_ptr_impl<cellb_*,_std::default_delete<cellb_*[]>_>)0x0;
  if (local_78.p._M_t.super___uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>._M_t.
      super__Tuple_impl<0UL,_cellb_***,_std::default_delete<cellb_**[]>_>.
      super__Head_base<0UL,_cellb_***,_false>._M_head_impl !=
      (__uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>)0x0) {
    operator_delete__((void *)local_78.p._M_t.
                              super___uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>._M_t
                              .super__Tuple_impl<0UL,_cellb_***,_std::default_delete<cellb_**[]>_>.
                              super__Head_base<0UL,_cellb_***,_false>._M_head_impl);
  }
  local_78.nx = 0;
  local_78.ny = 0;
  local_78.nz = 0;
  local_78.p3._M_t.super___uniq_ptr_impl<cellb,_std::default_delete<cellb[]>_>._M_t.
  super__Tuple_impl<0UL,_cellb_*,_std::default_delete<cellb[]>_>.
  super__Head_base<0UL,_cellb_*,_false>._M_head_impl =
       (__uniq_ptr_data<cellb,_std::default_delete<cellb[]>,_true,_true>)
       (__uniq_ptr_impl<cellb,_std::default_delete<cellb[]>_>)0x0;
  local_78.p._M_t.super___uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>._M_t.
  super__Tuple_impl<0UL,_cellb_***,_std::default_delete<cellb_**[]>_>.
  super__Head_base<0UL,_cellb_***,_false>._M_head_impl =
       (__uniq_ptr_data<cellb_**,_std::default_delete<cellb_**[]>,_true,_true>)
       (__uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>)0x0;
  local_78.p2._M_t.super___uniq_ptr_impl<cellb_*,_std::default_delete<cellb_*[]>_>._M_t.
  super__Tuple_impl<0UL,_cellb_**,_std::default_delete<cellb_*[]>_>.
  super__Head_base<0UL,_cellb_**,_false>._M_head_impl =
       (__uniq_ptr_data<cellb_*,_std::default_delete<cellb_*[]>,_true,_true>)
       (__uniq_ptr_impl<cellb_*,_std::default_delete<cellb_*[]>_>)0x0;
  field3d<cellp>::operator=(&this->cp,(field3d<cellp> *)&local_78);
  if ((_Head_base<0UL,_cellb_*,_false>)
      local_78.p3._M_t.super___uniq_ptr_impl<cellb,_std::default_delete<cellb[]>_>._M_t.
      super__Tuple_impl<0UL,_cellb_*,_std::default_delete<cellb[]>_>.
      super__Head_base<0UL,_cellb_*,_false>._M_head_impl != (_Head_base<0UL,_cellb_*,_false>)0x0) {
    operator_delete__((void *)local_78.p3._M_t.
                              super___uniq_ptr_impl<cellb,_std::default_delete<cellb[]>_>._M_t.
                              super__Tuple_impl<0UL,_cellb_*,_std::default_delete<cellb[]>_>.
                              super__Head_base<0UL,_cellb_*,_false>._M_head_impl);
  }
  local_78.p3._M_t.super___uniq_ptr_impl<cellb,_std::default_delete<cellb[]>_>._M_t.
  super__Tuple_impl<0UL,_cellb_*,_std::default_delete<cellb[]>_>.
  super__Head_base<0UL,_cellb_*,_false>._M_head_impl =
       (__uniq_ptr_data<cellb,_std::default_delete<cellb[]>,_true,_true>)
       (__uniq_ptr_impl<cellb,_std::default_delete<cellb[]>_>)0x0;
  if ((_Tuple_impl<0UL,_cellb_**,_std::default_delete<cellb_*[]>_>)
      local_78.p2._M_t.super___uniq_ptr_impl<cellb_*,_std::default_delete<cellb_*[]>_>._M_t.
      super__Tuple_impl<0UL,_cellb_**,_std::default_delete<cellb_*[]>_>.
      super__Head_base<0UL,_cellb_**,_false>._M_head_impl != (cellb **)0x0) {
    operator_delete__((void *)local_78.p2._M_t.
                              super___uniq_ptr_impl<cellb_*,_std::default_delete<cellb_*[]>_>._M_t.
                              super__Tuple_impl<0UL,_cellb_**,_std::default_delete<cellb_*[]>_>.
                              super__Head_base<0UL,_cellb_**,_false>._M_head_impl);
  }
  local_78.p2._M_t.super___uniq_ptr_impl<cellb_*,_std::default_delete<cellb_*[]>_>._M_t.
  super__Tuple_impl<0UL,_cellb_**,_std::default_delete<cellb_*[]>_>.
  super__Head_base<0UL,_cellb_**,_false>._M_head_impl =
       (__uniq_ptr_data<cellb_*,_std::default_delete<cellb_*[]>,_true,_true>)
       (__uniq_ptr_impl<cellb_*,_std::default_delete<cellb_*[]>_>)0x0;
  if (local_78.p._M_t.super___uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>._M_t.
      super__Tuple_impl<0UL,_cellb_***,_std::default_delete<cellb_**[]>_>.
      super__Head_base<0UL,_cellb_***,_false>._M_head_impl !=
      (__uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>)0x0) {
    operator_delete__((void *)local_78.p._M_t.
                              super___uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>._M_t
                              .super__Tuple_impl<0UL,_cellb_***,_std::default_delete<cellb_**[]>_>.
                              super__Head_base<0UL,_cellb_***,_false>._M_head_impl);
  }
  this->n_random = 0;
  iVar1 = getpagesize();
  this->n_ap = 0;
  this->n_f = 0;
  this->npwpa = 0;
  this->npwpo = 0;
  this->energy_e_deleted = 0.0;
  this->energy_p_deleted = 0.0;
  iVar2 = 0x4000000;
  if (0x4000000 < iVar1) {
    iVar2 = iVar1;
  }
  this->energy_ph_deleted = 0.0;
  this->page_size = iVar2;
  this->particle_size = 0x68;
  this->pointer_size = 8;
  this->n_ion_populations = 0;
  this->icmr = (double *)0x0;
  auVar3 = ZEXT432(0) << 0x40;
  this->p_lap = (particle *)auVar3._0_8_;
  this->pp_lfp = (particle **)auVar3._8_8_;
  this->p_lapwpa = (pwpa *)auVar3._16_8_;
  this->p_lapwpo = (pwpo *)auVar3._24_8_;
  std::__cxx11::string::_M_replace
            ((ulong)&this->data_folder,0,(char *)(this->data_folder)._M_string_length,0x1377c0);
  return;
}

Assistant:

spatial_region::spatial_region()
{
    nx = 0;
    ny = 0;
    nz = 0;
    dx = 1;
    dy = 1;
    dz = 1;
    dt = 0.5;
    xnpic = 1;
    ynpic = 1;
    znpic = 1;
    e_s = 1e10;
    ce = field3d<celle>();
    cj = field3d<cellj>();
    cb = field3d<cellb>();
    cbe = field3d<cellbe>();
    cp = field3d<cellp>();
    n_random = 0;
    energy_e_deleted = 0;
    energy_p_deleted = 0;
    energy_ph_deleted = 0;
    //
    n_ap = 0;
    n_f = 0;
    npwpa = 0;
    npwpo = 0;
    // page_size should not be very small to avoid OS problems with allocation
    const int PS = 64 * 1024 * 1024; // bytes
    if (getpagesize() < PS) {
        page_size = PS;
    } else {
        page_size = getpagesize();
    }
    particle_size = sizeof(particle);
    pointer_size = sizeof(particle*);
    p_lap = 0;
    pp_lfp = 0;
    p_lapwpa = 0;
    p_lapwpo = 0;
    n_ion_populations = 0;
    icmr = 0;
    data_folder = "results";
}